

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall HttpSession::on_read(HttpSession *this,error_code eCode,size_t bytes_transferred)

{
  element_type *peVar1;
  error_category *peVar2;
  
  peVar2 = eCode.cat_;
  if (peVar2 == (error_category *)
                boost::beast::http::make_error_code(boost::beast::http::error)::cat &&
      (eCode._0_8_ & 0xffffffff) == 1) {
    peVar1 = (this->stream).impl_.px;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
              ((peVar1->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               .impl_.service_,(int)peVar1 + 0x18,1);
  }
  else {
    if ((eCode._0_8_ >> 0x20 & 1) == 0) {
      handle_request<boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,HttpSession::send_lambda&>
                (&this->req,&this->lambda);
      return;
    }
    if ((eCode.val_ != 1) ||
       (peVar2->id_ != 0 ||
        peVar2 != (error_category *)boost::beast::make_error_code(boost::beast::error)::cat)) {
      fail(eCode,"helics web server read");
      return;
    }
  }
  return;
}

Assistant:

void on_read(beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        // This means they closed the connection
        if (eCode == http::error::end_of_stream) {
            return do_close();
        }

        if (eCode) {
            if (beast::error::timeout != eCode) {
                fail(eCode, "helics web server read");
            }
            return;
        }

        // Send the response
        handle_request(std::move(req), lambda);
    }